

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  timediff_t *ptVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  size_t sVar5;
  bool bVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  char *in_RAX;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  size_t nread;
  char *local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  local_38 = in_RAX;
  if (((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) &&
     (pcVar11 = (char *)(pcVar3->proto).ftpc.pp.response_time, pcVar11 != (char *)0x0)) {
    local_38 = (char *)(ulong)(data->set).upload_buffer_size;
    if (pcVar11 < local_38) {
      local_38 = pcVar11;
    }
    (data->req).upload_fromhere = (data->state).ulbuf;
    CVar8 = Curl_fillreadbuffer(data,(size_t)local_38,(size_t *)&local_38);
    if ((CVar8 == CURLE_AGAIN) || (CVar8 == CURLE_OK)) {
      if (local_38 == (char *)0x0) {
        bVar6 = false;
        CVar8 = CURLE_OK;
      }
      else {
        ptVar2 = &(pcVar3->proto).ftpc.pp.response_time;
        *ptVar2 = *ptVar2 - (long)local_38;
        (pcVar3->proto).ftpc.pp.sendbuf.bufr = local_38;
        (pcVar3->proto).ftpc.pp.sendbuf.leng = 0;
        bVar6 = true;
        CVar8 = CURLE_OK;
      }
    }
    else {
      bVar6 = false;
    }
    if (!bVar6) {
      return CVar8;
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) goto LAB_0072bd0c;
  pcVar4 = data->conn;
  pcVar11 = (pcVar4->proto).ftpc.pp.sendbuf.bufr;
  if (pcVar11 == (char *)0x0) {
LAB_0072bd02:
    CVar8 = CURLE_OK;
  }
  else {
    sVar5 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
    pcVar11 = pcVar11 + -sVar5;
    CVar8 = Curl_nwrite(data,0,(data->state).ulbuf + sVar5,(size_t)pcVar11,(ssize_t *)&local_38);
    if (CVar8 == CURLE_OK) {
      if (local_38 == pcVar11) {
        (pcVar4->proto).ftpc.pp.sendbuf.bufr = (char *)0x0;
      }
      else {
        psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.leng;
        *psVar1 = (size_t)(local_38 + *psVar1);
      }
      goto LAB_0072bd02;
    }
  }
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
LAB_0072bd0c:
  CVar8 = CURLE_AGAIN;
  if (((pcVar3->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) &&
     ((pcVar3->proto).ftpc.pp.response_time == 0)) {
    pcVar3 = data->conn;
    pcVar11 = (pcVar3->proto).smbc.recv_buf;
    sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.allc;
    CVar8 = Curl_read(data,pcVar3->sock[0],pcVar11 + sVar5,0x9000 - sVar5,(ssize_t *)&local_38);
    if ((CVar8 == CURLE_OK) &&
       ((CVar8 = CURLE_OK, local_38 != (char *)0x0 &&
        (sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.allc,
        (pcVar3->proto).ftpc.pp.sendbuf.allc = (size_t)(local_38 + sVar5),
        (char *)0x3 < local_38 + sVar5)))) {
      uVar7 = Curl_read16_be((uchar *)(pcVar11 + 2));
      if ((ulong)uVar7 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.allc) {
        if (0x20 < uVar7) {
          uVar9 = (uint)(byte)pcVar11[0x24] * 2 + 0x27;
          uVar10 = (uint)((ulong)uVar7 + 4);
          if ((uVar9 <= uVar10) &&
             (uVar7 = Curl_read16_le((uchar *)(pcVar11 +
                                              (ulong)((uint)(byte)pcVar11[0x24] * 2) + 0x25)),
             uVar10 < uVar9 + uVar7)) {
            return CURLE_READ_ERROR;
          }
        }
        *msg = pcVar11;
        CVar8 = CURLE_OK;
      }
    }
  }
  return CVar8;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}